

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sign_pss.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  FILE *__s;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char *__format;
  size_t olen;
  mbedtls_pk_context pk;
  uchar hash [32];
  mbedtls_ctr_drbg_context ctr_drbg;
  char filename [512];
  mbedtls_entropy_context entropy;
  uchar buf [1024];
  
  olen = 0;
  mbedtls_entropy_init(&entropy);
  mbedtls_pk_init(&pk);
  mbedtls_ctr_drbg_init(&ctr_drbg);
  if (argc != 3) {
    puts("usage: rsa_sign_pss <key_file> <filename>");
LAB_0010a380:
    uVar1 = 1;
    goto LAB_0010a3e4;
  }
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  uVar1 = mbedtls_ctr_drbg_seed(&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"rsa_sign_pss",0xc)
  ;
  if (uVar1 == 0) {
    printf("\n  . Reading private key from \'%s\'",argv[1]);
    fflush(_stdout);
    iVar2 = mbedtls_pk_parse_keyfile(&pk,argv[1],anon_var_dwarf_1bc9e + 9);
    if (iVar2 == 0) {
      uVar1 = 1;
      iVar2 = mbedtls_pk_can_do(&pk,MBEDTLS_PK_RSA);
      if (iVar2 == 0) {
        puts(" failed\n  ! Key is not an RSA key");
        goto LAB_0010a3e4;
      }
      mbedtls_rsa_set_padding((mbedtls_rsa_context *)pk.pk_ctx,1,6);
      printf("\n  . Generating the RSA/SHA-256 signature");
      fflush(_stdout);
      md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
      uVar1 = mbedtls_md_file(md_info,argv[2],hash);
      if (uVar1 == 0) {
        uVar1 = mbedtls_pk_sign(&pk,MBEDTLS_MD_SHA256,hash,0,buf,&olen,mbedtls_ctr_drbg_random,
                                &ctr_drbg);
        if (uVar1 != 0) {
          pcVar5 = " failed\n  ! mbedtls_pk_sign returned %d\n\n";
          goto LAB_0010a370;
        }
        snprintf(filename,0x200,"%s.sig",argv[2]);
        __s = fopen(filename,"wb+");
        if (__s == (FILE *)0x0) {
          printf(" failed\n  ! Could not create %s\n\n",filename);
          goto LAB_0010a380;
        }
        sVar3 = fwrite(buf,1,olen,__s);
        if (sVar3 != olen) {
          puts("failed\n  ! fwrite failed\n");
          fclose(__s);
          uVar1 = 0;
          goto LAB_0010a3e4;
        }
        fclose(__s);
        __format = "\n  . Done (created \"%s\")\n\n";
        uVar1 = 0;
        pcVar5 = filename;
      }
      else {
        pcVar5 = argv[2];
        __format = " failed\n  ! Could not open or read %s\n\n";
      }
      printf(__format,pcVar5);
      goto LAB_0010a3e4;
    }
    printf(" failed\n  ! Could not read key from \'%s\'\n",argv[1]);
    pcVar5 = "  ! mbedtls_pk_parse_public_keyfile returned %d\n\n";
    uVar1 = 1;
    uVar4 = 1;
  }
  else {
    pcVar5 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
LAB_0010a370:
    uVar4 = (ulong)uVar1;
  }
  printf(pcVar5,uVar4);
LAB_0010a3e4:
  mbedtls_pk_free(&pk);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  return uVar1;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1;
    mbedtls_pk_context pk;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char hash[32];
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    char filename[512];
    const char *pers = "rsa_sign_pss";
    size_t olen = 0;

    mbedtls_entropy_init( &entropy );
    mbedtls_pk_init( &pk );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    if( argc != 3 )
    {
        mbedtls_printf( "usage: rsa_sign_pss <key_file> <filename>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading private key from '%s'", argv[1] );
    fflush( stdout );

    if( ( ret = mbedtls_pk_parse_keyfile( &pk, argv[1], "" ) ) != 0 )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not read key from '%s'\n", argv[1] );
        mbedtls_printf( "  ! mbedtls_pk_parse_public_keyfile returned %d\n\n", ret );
        goto exit;
    }

    if( !mbedtls_pk_can_do( &pk, MBEDTLS_PK_RSA ) )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Key is not an RSA key\n" );
        goto exit;
    }

    mbedtls_rsa_set_padding( mbedtls_pk_rsa( pk ), MBEDTLS_RSA_PKCS_V21, MBEDTLS_MD_SHA256 );

    /*
     * Compute the SHA-256 hash of the input file,
     * then calculate the RSA signature of the hash.
     */
    mbedtls_printf( "\n  . Generating the RSA/SHA-256 signature" );
    fflush( stdout );

    if( ( ret = mbedtls_md_file(
                    mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ),
                    argv[2], hash ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not open or read %s\n\n", argv[2] );
        goto exit;
    }

    if( ( ret = mbedtls_pk_sign( &pk, MBEDTLS_MD_SHA256, hash, 0, buf, &olen,
                         mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_sign returned %d\n\n", ret );
        goto exit;
    }

    /*
     * Write the signature into <filename>.sig
     */
    mbedtls_snprintf( filename, 512, "%s.sig", argv[2] );

    if( ( f = fopen( filename, "wb+" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", filename );
        goto exit;
    }

    if( fwrite( buf, 1, olen, f ) != olen )
    {
        mbedtls_printf( "failed\n  ! fwrite failed\n\n" );
        fclose( f );
        goto exit;
    }

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", filename );

exit:
    mbedtls_pk_free( &pk );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}